

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::yarn4>(yarn4 *r,string *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  char local_3a [2];
  ulong local_38;
  
  uVar8 = name->_M_string_length;
  while (uVar8 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar8 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar8);
  iVar10 = 0xf;
  local_38 = 0xfffffffd;
  do {
    iVar1 = (r->S).r[0];
    iVar2 = (r->S).r[1];
    iVar3 = (r->S).r[2];
    uVar8 = (long)(r->S).r[3] * (long)(r->P).a[3] + (long)(r->P).a[2] * (long)iVar3 +
            (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar1;
    (r->S).r[3] = iVar3;
    uVar9 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
    uVar8 = uVar9 - 0x1fffffffc;
    if (uVar9 < 0x1fffffffc) {
      uVar8 = uVar9;
    }
    uVar9 = uVar8 - 0xfffffffe;
    if (uVar8 <= local_38) {
      uVar9 = uVar8;
    }
    (r->S).r[2] = iVar2;
    (r->S).r[1] = iVar1;
    uVar4 = (uint)uVar9 + 0x80000001;
    if (uVar9 < 0x7fffffff) {
      uVar4 = (uint)uVar9;
    }
    (r->S).r[0] = uVar4;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      uVar6 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar4 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar4 >> 0x10) * 4 + 0x40000)) &
              0x7fffffff;
      iVar1 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar4 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar4 >> 0x10) * 4 + 0x40000) >>
                   0x1f);
      uVar7 = uVar6 + iVar1;
      uVar4 = uVar6 + 0x80000001 + iVar1;
      if (uVar7 < 0x7fffffff) {
        uVar4 = uVar7;
      }
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
    local_3a[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a,1);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  iVar10 = (r->S).r[0];
  iVar1 = (r->S).r[1];
  iVar2 = (r->S).r[2];
  uVar8 = (long)(r->S).r[3] * (long)(r->P).a[3] + (long)(r->P).a[2] * (long)iVar2 +
          (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar10;
  (r->S).r[3] = iVar2;
  uVar9 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
  uVar8 = uVar9 - 0x1fffffffc;
  if (uVar9 < 0x1fffffffc) {
    uVar8 = uVar9;
  }
  uVar9 = uVar8 - 0xfffffffe;
  if (uVar8 <= local_38) {
    uVar9 = uVar8;
  }
  (r->S).r[2] = iVar1;
  (r->S).r[1] = iVar10;
  uVar4 = (uint)uVar9 + 0x80000001;
  if (uVar9 < 0x7fffffff) {
    uVar4 = (uint)uVar9;
  }
  (r->S).r[0] = uVar4;
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar6 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar4 & 0xffff) * 4) *
                  (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar4 >> 0x10) * 4 + 0x40000)) &
            0x7fffffff;
    iVar10 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar4 & 0xffff) * 4) *
                   (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar4 >> 0x10) * 4 + 0x40000) >>
                  0x1f);
    uVar7 = uVar6 + iVar10;
    uVar4 = uVar6 + 0x80000001 + iVar10;
    if (uVar7 < 0x7fffffff) {
      uVar4 = uVar7;
    }
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
  local_3a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a + 1,1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}